

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcomparehelpers.h
# Opt level: O1

void __thiscall
QConfFileSettingsPrivate::ensureSectionParsed
          (QConfFileSettingsPrivate *this,QConfFile *confFile,QSettingsKey *key)

{
  UnparsedSettingsMap *this_00;
  QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
  *pQVar1;
  bool bVar2;
  qsizetype qVar3;
  iterator iVar4;
  const_iterator afirst;
  const_iterator alast;
  ParsedSettingsMap *in_R8;
  QByteArrayView data;
  
  pQVar1 = (confFile->unparsedIniSections).d.d.ptr;
  if ((pQVar1 != (QMapData<std::map<QSettingsKey,_QByteArray,_std::less<QSettingsKey>,_std::allocator<std::pair<const_QSettingsKey,_QByteArray>_>_>_>
                  *)0x0) && ((pQVar1->m)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0)) {
    this_00 = &confFile->unparsedIniSections;
    qVar3 = QString::indexOf(&key->super_QString,(QChar)0x2f,0,CaseSensitive);
    if (qVar3 == -1) {
      QMap<QSettingsKey,_QByteArray>::detach(this_00);
      afirst._M_node =
           *(_Base_ptr *)
            ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10);
      QMap<QSettingsKey,_QByteArray>::detach(this_00);
      if (((_Rb_tree_header *)afirst._M_node !=
           &(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header) &&
         (afirst._M_node[1]._M_left == (_Base_ptr)0x0)) goto LAB_00438915;
    }
    else {
      iVar4 = QMap<QSettingsKey,_QByteArray>::upperBound(this_00,key);
      QMap<QSettingsKey,_QByteArray>::detach(this_00);
      if ((iVar4.i._M_node !=
           (iterator)
           *(_Base_ptr *)
            ((long)&(((this_00->d).d.ptr)->m)._M_t._M_impl.super__Rb_tree_header._M_header + 0x10))
         && ((afirst._M_node =
                   (_Base_ptr)std::_Rb_tree_decrement((_Rb_tree_node_base *)iVar4.i._M_node),
             afirst._M_node[1]._M_left != (_Base_ptr)0x0 &&
             (bVar2 = QString::startsWith(&key->super_QString,(QString *)(afirst._M_node + 1),
                                          CaseSensitive), bVar2)))) {
LAB_00438915:
        data.m_data = (storage_type *)&confFile->originalKeys;
        data.m_size = *(qsizetype *)((long)afirst._M_node + 0x40);
        bVar2 = readIniSection((QConfFileSettingsPrivate *)((long)afirst._M_node + 0x20),
                               *(QSettingsKey **)((long)afirst._M_node + 0x48),data,in_R8);
        if ((!bVar2) && ((this->super_QSettingsPrivate).status == NoError)) {
          (this->super_QSettingsPrivate).status = FormatError;
        }
        alast.i._M_node = (const_iterator)std::_Rb_tree_increment(afirst._M_node);
        QMap<QSettingsKey,_QByteArray>::erase(this_00,(const_iterator)afirst._M_node,alast);
        return;
      }
    }
  }
  return;
}

Assistant:

constexpr P get() const noexcept { return ptr; }